

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O1

void Logger::clear(void)

{
  std::vector<Logger::QueueEntry,_std::allocator<Logger::QueueEntry>_>::_M_erase_at_end
            (&queue,queue.
                    super__Vector_base<Logger::QueueEntry,_std::allocator<Logger::QueueEntry>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&errors_abi_cxx11_,
                    errors_abi_cxx11_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  error = false;
  fatalError = false;
  errorOnWarning = false;
  silent = false;
  return;
}

Assistant:

void Logger::clear()
{
	queue.clear();
	errors.clear();
	error = false;
	fatalError = false;
	errorOnWarning = false;
	silent = false;
}